

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_char>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_char>,_QString> *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->b).d);
  QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)this);
  return;
}

Assistant:

~QStringBuilder() = default;